

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O0

void __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::SetColorMaski
          (BlendMaskStateMachine *this,int idx,GLboolean r,GLboolean g,GLboolean b,GLboolean a)

{
  reference pvVar1;
  GLboolean a_local;
  GLboolean b_local;
  GLboolean g_local;
  GLboolean r_local;
  int idx_local;
  BlendMaskStateMachine *this_local;
  
  (*this->gl->colorMaski)(idx,r,g,b,a);
  pvVar1 = std::
           vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ::operator[](&this->state,(long)idx);
  pvVar1->mask_r = r;
  pvVar1 = std::
           vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ::operator[](&this->state,(long)idx);
  pvVar1->mask_g = g;
  pvVar1 = std::
           vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ::operator[](&this->state,(long)idx);
  pvVar1->mask_b = b;
  pvVar1 = std::
           vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ::operator[](&this->state,(long)idx);
  pvVar1->mask_a = a;
  return;
}

Assistant:

void DrawBuffersIndexedBase::BlendMaskStateMachine::SetColorMaski(int idx, glw::GLboolean r, glw::GLboolean g,
																  glw::GLboolean b, glw::GLboolean a)
{
	gl.colorMaski(idx, r, g, b, a);
	state[idx].mask_r = r;
	state[idx].mask_g = g;
	state[idx].mask_b = b;
	state[idx].mask_a = a;
}